

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O2

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Label *label)

{
  ostream *poVar1;
  int iVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar2 = this->spaces_ + 2;
  this->spaces_ = iVar2;
  poVar1 = this->out_;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,(char)iVar2);
  poVar1 = std::operator<<(poVar1,(string *)local_40);
  poVar1 = std::operator<<(poVar1,"<label>");
  poVar1 = std::operator<<(poVar1,(string *)
                                  &((label->super_Stmt).token_.
                                    super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->identifier_);
  std::operator<<(poVar1,"</label>\n");
  std::__cxx11::string::~string((string *)local_40);
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Label &label) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<label>"
       << label.token_->String() << "</label>\n";
  spaces_ -= TAB_SIZE;
  return 0;
}